

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::verifySize(int NW,int NA,int NEP)

{
  undefined8 *puVar1;
  
  if ((NA + 2) * NEP == NW) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal NA, NW and NEP values ");
  tools::Log::info<char_const*>
            ("NW must be equal to NEP*(NA+2) for continuum energy-angle distributions");
  tools::Log::info<char_const*,int>("NW value: {}",NW);
  tools::Log::info<char_const*,int>("NA value: {}",NA);
  tools::Log::info<char_const*,int>("NEP value: {}",NEP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NW, int NA, int NEP ) {

  if ( NW != NEP * ( NA + 2 ) ) {

    Log::error( "Encountered illegal NA, NW and NEP values " );
    Log::info( "NW must be equal to NEP*(NA+2) for continuum energy-angle "
               "distributions" );
    Log::info( "NW value: {}", NW );
    Log::info( "NA value: {}", NA );
    Log::info( "NEP value: {}", NEP );
    throw std::exception();
  }
}